

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<std::__cxx11::string,int,bool,std::vector<int,std::allocator<int>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          bool *args_2,vector<int,_std::allocator<int>_> *args_3)

{
  char **ppcVar1;
  Queue *pQVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t sizes [6];
  long local_68 [7];
  
  local_68[0] = 8;
  local_68[1] = 8;
  local_68[2] = args->_M_string_length + 4;
  local_68[3] = 4;
  local_68[4] = 1;
  local_68[5] = (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                (4 - (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  lVar8 = 0;
  lVar9 = 0;
  lVar4 = 0;
  do {
    lVar8 = lVar8 + local_68[lVar4];
    lVar9 = lVar9 + local_68[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 6);
  uVar7 = lVar9 + lVar8 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar7) {
    sVar5 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar5 < uVar7) &&
        (replaceChannel(this,uVar7),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar7)) &&
       (sVar5 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar5 < uVar7)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)(lVar9 + lVar8);
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 4;
  *(uint64_t *)(pcVar6 + 4) = eventSourceId;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  *(uint64_t *)(pcVar6 + 8) = clock;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  uVar7 = args->_M_string_length;
  iVar3 = (int)uVar7;
  *(int *)(pcVar6 + 8) = iVar3;
  pcVar6 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar6;
  if (iVar3 != 0) {
    uVar7 = uVar7 & 0xffffffff;
    memcpy(pcVar6,(args->_M_dataplus)._M_p,uVar7);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar7;
  }
  *(int *)(this->_qw)._writePos = *args_1;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 4;
  pcVar6[4] = *args_2;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 1;
  uVar7 = (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar3 = (int)(uVar7 >> 2);
  *(int *)(pcVar6 + 1) = iVar3;
  pcVar6 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar6;
  if (iVar3 != 0) {
    uVar7 = uVar7 & 0x3fffffffc;
    memcpy(pcVar6,(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar7);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar7;
  }
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}